

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O3

bool __thiscall ON_BezierCurve::SetCV(ON_BezierCurve *this,int i,point_style style,double *Point)

{
  double *__dest;
  double dVar1;
  long lVar2;
  long lVar3;
  size_t __n;
  ulong uVar4;
  
  if (i < 0) {
    return false;
  }
  if (this->m_cv == (double *)0x0) {
    return false;
  }
  if (this->m_order <= i) {
    return false;
  }
  if (3 < style - not_rational) {
    return false;
  }
  __dest = this->m_cv + i * this->m_cv_stride;
  switch(style) {
  case not_rational:
    memcpy(__dest,Point,(long)this->m_dim << 3);
    if (this->m_is_rat != 0) {
      __dest[this->m_dim] = 1.0;
      return true;
    }
    return true;
  case homogeneous_rational:
    lVar3 = (long)this->m_dim;
    if (this->m_is_rat == 0) {
      if (0 < this->m_dim) {
        dVar1 = Point[lVar3];
        uVar4 = -(ulong)(dVar1 != 0.0);
        lVar2 = 0;
        do {
          __dest[lVar2] =
               Point[lVar2] * (double)(~uVar4 & 0x3ff0000000000000 | (ulong)(1.0 / dVar1) & uVar4);
          lVar2 = lVar2 + 1;
        } while (lVar3 != lVar2);
        return true;
      }
      return true;
    }
    __n = lVar3 * 8 + 8;
    goto LAB_003cecbd;
  case euclidean_rational:
    lVar3 = (long)this->m_dim;
    if (this->m_is_rat != 0) {
      dVar1 = Point[lVar3];
      if (0 < this->m_dim) {
        lVar2 = 0;
        do {
          __dest[lVar2] = Point[lVar2] * dVar1;
          lVar2 = lVar2 + 1;
        } while (lVar3 != lVar2);
      }
      __dest[lVar3] = dVar1;
      return true;
    }
    break;
  case intrinsic_point_style:
    lVar3 = ((long)this->m_dim + 1) - (ulong)(this->m_is_rat == 0);
  }
  __n = lVar3 << 3;
LAB_003cecbd:
  memcpy(__dest,Point,__n);
  return true;
}

Assistant:

bool ON_BezierCurve::SetCV( int i, ON::point_style style, const double* Point )
{
  bool rc = true;
  int k;
  double w;

  // feeble but fast check for properly initialized class
  if ( !m_cv || i < 0 || i >= m_order )
    return false;

  double* cv = m_cv + i*m_cv_stride;

  switch ( style ) {

  case ON::not_rational:  // input Point is not rational
    memcpy( cv, Point, m_dim*sizeof(*cv) );
    if ( IsRational() ) {
      // NURBS curve is rational - set weight to one
      cv[m_dim] = 1.0;
    }
    break;

  case ON::homogeneous_rational:  // input Point is homogeneous rational
    if ( IsRational() ) {
      // NURBS curve is rational
      memcpy( cv, Point, (m_dim+1)*sizeof(*cv) );
    }
    else {
      // NURBS curve is not rational
      w = (Point[m_dim] != 0.0) ? 1.0/Point[m_dim] : 1.0;
      for ( k = 0; k < m_dim; k++ ) {
        cv[k] = w*Point[k];
      }
    }
    break;

  case ON::euclidean_rational:  // input Point is euclidean rational
    if ( IsRational() ) {
      // NURBS curve is rational - convert euclean point to homogeneous form
      w = Point[m_dim];
      for ( k = 0; k < m_dim; k++ )
        cv[k] = w*Point[k];
      cv[m_dim] = w;
    }
    else {
      // NURBS curve is not rational
      memcpy( cv, Point, m_dim*sizeof(*cv) );
    }
    break;

  case ON::intrinsic_point_style:
    k = m_is_rat?m_dim+1:m_dim;
    memcpy(cv,Point,k*sizeof(cv[0]));
    break;

  default:
    rc = false;
    break;
  }

  return rc;
}